

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

bool __thiscall State::AddOut(State *this,Edge *edge,StringPiece path,uint64_t slash_bits)

{
  Edge *pEVar1;
  Node *node;
  Node *local_20;
  
  local_20 = GetNode(this,path,slash_bits);
  pEVar1 = local_20->in_edge_;
  if (pEVar1 == (Edge *)0x0) {
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&edge->outputs_,&local_20);
    local_20->in_edge_ = edge;
  }
  return pEVar1 == (Edge *)0x0;
}

Assistant:

bool State::AddOut(Edge* edge, StringPiece path, uint64_t slash_bits) {
  Node* node = GetNode(path, slash_bits);
  if (node->in_edge())
    return false;
  edge->outputs_.push_back(node);
  node->set_in_edge(edge);
  return true;
}